

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugLine::Sequence::reset(Sequence *this)

{
  this->LowPC = 0;
  this->HighPC = 0;
  this->SectionIndex = 0xffffffffffffffff;
  this->FirstRowIndex = 0;
  this->LastRowIndex = 0;
  this->Empty = true;
  return;
}

Assistant:

void DWARFDebugLine::Sequence::reset() {
  LowPC = 0;
  HighPC = 0;
  SectionIndex = object::SectionedAddress::UndefSection;
  FirstRowIndex = 0;
  LastRowIndex = 0;
  Empty = true;
}